

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O1

void __thiscall disp::p_2(disp *this,int x,int y)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  to_string<int>(&local_48,x);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x134de0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_b8 = *puVar5;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar5;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  to_string<int>(&local_88,y);
  uVar6 = 0xf;
  if (local_c8 != &local_b8) {
    uVar6 = local_b8;
  }
  if (uVar6 < local_88._M_string_length + local_c0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar7 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_c0 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0012810b;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
LAB_0012810b:
  local_a8 = &local_98;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (undefined8 *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void p_2(int x,int y) { v_="p_2:" + to_string(x) + ":" + to_string(y); }